

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::uadd_carry_invalid_x
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  ShaderFunction xDataType;
  bool bVar1;
  char *__s;
  long *plVar2;
  size_type *psVar3;
  long lVar4;
  string shaderSource;
  DataType in_stack_ffffffffffffff10;
  string local_e8;
  allocator<char> local_c1;
  long local_c0;
  string local_b8;
  string local_98;
  long local_78;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,"uaddCarry: Invalid x type.","");
  NegativeTestContext::beginSection(ctx,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  lVar4 = 0;
  do {
    shaderType = (&NegativeTestShared::(anonymous_namespace)::s_shaders)[lVar4];
    bVar1 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar1) {
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_50,__s,&local_c1);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1cbc003);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      psVar3 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar3) {
        local_e8.field_2._M_allocated_capacity = *psVar3;
        local_e8.field_2._8_8_ = plVar2[3];
      }
      else {
        local_e8.field_2._M_allocated_capacity = *psVar3;
        local_e8._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_e8._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      NegativeTestContext::beginSection(ctx,&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      local_78 = lVar4;
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      lVar4 = 0;
      do {
        xDataType = deqp::gles3::Functional::ShaderOperatorTests::init()::s_uintTypes[lVar4];
        local_c0 = lVar4;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceAddCarrySubBorrow_abi_cxx11_
                  (&local_e8,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   SHADERTYPE_TESSELLATION_EVALUATION,
                   deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes[lVar4],
                   xDataType,xDataType,in_stack_ffffffffffffff10);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,local_e8._M_dataplus._M_p,
                   local_e8._M_dataplus._M_p + local_e8._M_string_length);
        verifyShader(ctx,shaderType,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        NegativeTestShared::(anonymous_namespace)::genShaderSourceAddCarrySubBorrow_abi_cxx11_
                  (&local_e8,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   SHADERTYPE_TESSELLATION_EVALUATION,
                   deqp::gles2::Performance::ShaderOperatorTests::init()::intTypes[local_c0],
                   xDataType,xDataType,in_stack_ffffffffffffff10);
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,local_e8._M_dataplus._M_p,
                   local_e8._M_dataplus._M_p + local_e8._M_string_length);
        verifyShader(ctx,shaderType,&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        lVar4 = 0;
        do {
          if (*(ShaderFunction *)
               ((long)deqp::gles3::Functional::ShaderOperatorTests::init()::s_uintTypes + lVar4) !=
              xDataType) {
            NegativeTestShared::(anonymous_namespace)::genShaderSourceAddCarrySubBorrow_abi_cxx11_
                      (&local_e8,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_TESSELLATION_EVALUATION,
                       *(ShaderFunction *)
                        ((long)deqp::gles3::Functional::ShaderOperatorTests::init()::s_uintTypes +
                        lVar4),xDataType,xDataType,in_stack_ffffffffffffff10);
            local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b8,local_e8._M_dataplus._M_p,
                       local_e8._M_dataplus._M_p + local_e8._M_string_length);
            verifyShader(ctx,shaderType,&local_b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
            }
          }
          lVar4 = lVar4 + 4;
        } while (lVar4 != 0x10);
        lVar4 = local_c0 + 1;
      } while (lVar4 != 4);
      NegativeTestContext::endSection(ctx);
      lVar4 = local_78;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void uadd_carry_invalid_x (NegativeTestContext& ctx)
{
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_uintTypes));
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_intTypes));

	ctx.beginSection("uaddCarry: Invalid x type.");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_floatTypes); ++dataTypeNdx)
			{
				{
					const std::string shaderSource(genShaderSourceAddCarrySubBorrow(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_UADD_CARRY, s_floatTypes[dataTypeNdx], s_uintTypes[dataTypeNdx], s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceAddCarrySubBorrow(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_UADD_CARRY, s_intTypes[dataTypeNdx], s_uintTypes[dataTypeNdx], s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				for (int dataTypeNdx2 = 0; dataTypeNdx2 < DE_LENGTH_OF_ARRAY(s_floatTypes); ++dataTypeNdx2)
				{
					if (s_uintTypes[dataTypeNdx2] == s_uintTypes[dataTypeNdx])
						continue;

					const std::string shaderSource(genShaderSourceAddCarrySubBorrow(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_UADD_CARRY, s_uintTypes[dataTypeNdx2], s_uintTypes[dataTypeNdx], s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}